

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

size_t strarray_get_count(strarray *array)

{
  size_t sVar1;
  bool bVar2;
  char *local_20;
  char *ptr;
  size_t count;
  strarray *array_local;
  
  ptr = (char *)0x0;
  local_20 = array->value;
  while( true ) {
    bVar2 = false;
    if (local_20 != (char *)0x0) {
      bVar2 = local_20 < array->value + array->length;
    }
    if (!bVar2) break;
    ptr = ptr + 1;
    sVar1 = strlen(local_20);
    local_20 = local_20 + sVar1 + 1;
  }
  return (size_t)ptr;
}

Assistant:

size_t
strarray_get_count(const struct strarray *array) {
  size_t count = 0;
  char *ptr;

  strarray_for_each_element(array, ptr) {
    count++;
  }
  return count;
}